

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FuncInfo.h
# Opt level: O1

uint __thiscall
FuncInfo::FindOrAddInlineCacheId
          (FuncInfo *this,RegSlot instanceSlot,PropertyId propertySlot,bool isLoadMethod,
          bool isStore)

{
  RealCount *pRVar1;
  ArenaAllocator *pAVar2;
  code *pcVar3;
  SList<InlineCacheUnit,_Memory::ArenaAllocator,_RealCount> *pSVar4;
  bool bVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  undefined4 *puVar10;
  Type pSVar11;
  BaseDictionary<int,_SList<InlineCacheUnit,_Memory::ArenaAllocator,_RealCount>_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *this_00;
  Type *pTVar12;
  uint uVar13;
  BaseDictionary<int,_SList<InlineCacheUnit,_Memory::ArenaAllocator,_RealCount>_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *local_50;
  InlineCacheIdMap *properties;
  SList<InlineCacheUnit,_Memory::ArenaAllocator,_RealCount> *pSStack_40;
  RegSlot instanceSlot_local;
  InlineCacheList *cacheList;
  PropertyId propertySlot_local;
  
  properties._4_4_ = instanceSlot;
  cacheList._4_4_ = propertySlot;
  if (instanceSlot == 0xffffffff) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar10 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/FuncInfo.h"
                       ,0x294,"(instanceSlot != Js::Constants::NoRegister)",
                       "instanceSlot != Js::Constants::NoRegister");
    if (!bVar5) goto LAB_00827f27;
    *puVar10 = 0;
  }
  if (cacheList._4_4_ == -1) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar10 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/FuncInfo.h"
                       ,0x295,"(propertySlot != Js::Constants::NoProperty)",
                       "propertySlot != Js::Constants::NoProperty");
    if (!bVar5) goto LAB_00827f27;
    *puVar10 = 0;
  }
  if (isLoadMethod && isStore) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar10 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/FuncInfo.h"
                       ,0x296,"(!isLoadMethod || !isStore)","!isLoadMethod || !isStore");
    if (!bVar5) goto LAB_00827f27;
    *puVar10 = 0;
  }
  if (isStore) {
    if (cacheList._4_4_ == 0x178) {
      uVar6 = NewInlineCache(this);
      pSVar11 = (Type)new<Memory::ArenaAllocator>(0x10,this->alloc,0x366bee);
      *(uint *)&pSVar11[1].next = uVar6;
      pSVar11->next = (this->toStringStoreCacheIds).super_SListNodeBase<Memory::ArenaAllocator>.next
      ;
      (this->toStringStoreCacheIds).super_SListNodeBase<Memory::ArenaAllocator>.next = pSVar11;
      pRVar1 = &(this->toStringStoreCacheIds).super_RealCount;
      pRVar1->count = pRVar1->count + 1;
      return uVar6;
    }
    if (cacheList._4_4_ == 0x18e) {
      uVar6 = NewInlineCache(this);
      pSVar11 = (Type)new<Memory::ArenaAllocator>(0x10,this->alloc,0x366bee);
      *(uint *)&pSVar11[1].next = uVar6;
      pSVar11->next = (this->valueOfStoreCacheIds).super_SListNodeBase<Memory::ArenaAllocator>.next;
      (this->valueOfStoreCacheIds).super_SListNodeBase<Memory::ArenaAllocator>.next = pSVar11;
      pRVar1 = &(this->valueOfStoreCacheIds).super_RealCount;
      pRVar1->count = pRVar1->count + 1;
      return uVar6;
    }
  }
  bVar5 = JsUtil::
          BaseDictionary<unsigned_int,_JsUtil::BaseDictionary<int,_SList<InlineCacheUnit,_Memory::ArenaAllocator,_RealCount>_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
          ::TryGetValue<unsigned_int>
                    (this->inlineCacheMap,(uint *)((long)&properties + 4),&local_50);
  if (!bVar5) {
    this_00 = (BaseDictionary<int,_SList<InlineCacheUnit,_Memory::ArenaAllocator,_RealCount>_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
               *)new<Memory::ArenaAllocator>(0x38,this->alloc,0x366bee);
    JsUtil::
    BaseDictionary<int,_SList<InlineCacheUnit,_Memory::ArenaAllocator,_RealCount>_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
    ::BaseDictionary(this_00,this->alloc,0x11);
    local_50 = this_00;
    JsUtil::
    BaseDictionary<unsigned_int,JsUtil::BaseDictionary<int,SList<InlineCacheUnit,Memory::ArenaAllocator,RealCount>*,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>*,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
    ::
    Insert<(JsUtil::BaseDictionary<unsigned_int,JsUtil::BaseDictionary<int,SList<InlineCacheUnit,Memory::ArenaAllocator,RealCount>*,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>*,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)0>
              ((BaseDictionary<unsigned_int,JsUtil::BaseDictionary<int,SList<InlineCacheUnit,Memory::ArenaAllocator,RealCount>*,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>*,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                *)this->inlineCacheMap,(uint *)((long)&properties + 4),&local_50);
  }
  bVar5 = JsUtil::
          BaseDictionary<int,_SList<InlineCacheUnit,_Memory::ArenaAllocator,_RealCount>_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
          ::TryGetValue<int>(local_50,(int *)((long)&cacheList + 4),&stack0xffffffffffffffc0);
  if (!bVar5) {
    pSStack_40 = (SList<InlineCacheUnit,_Memory::ArenaAllocator,_RealCount> *)
                 new<Memory::ArenaAllocator>(0x18,this->alloc,0x366bee);
    pAVar2 = this->alloc;
    (pSStack_40->super_SListBase<InlineCacheUnit,_Memory::ArenaAllocator,_RealCount>).
    super_RealCount.count = 0;
    (pSStack_40->super_SListBase<InlineCacheUnit,_Memory::ArenaAllocator,_RealCount>).
    super_SListNodeBase<Memory::ArenaAllocator>.next = (Type)pSStack_40;
    pSStack_40->allocator = pAVar2;
    JsUtil::
    BaseDictionary<int,SList<InlineCacheUnit,Memory::ArenaAllocator,RealCount>*,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
    ::
    Insert<(JsUtil::BaseDictionary<int,SList<InlineCacheUnit,Memory::ArenaAllocator,RealCount>*,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)0>
              ((BaseDictionary<int,SList<InlineCacheUnit,Memory::ArenaAllocator,RealCount>*,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                *)local_50,(int *)((long)&cacheList + 4),&stack0xffffffffffffffc0);
  }
  if ((DAT_015d6347 == '\x01') &&
     (1 < (pSStack_40->super_SListBase<InlineCacheUnit,_Memory::ArenaAllocator,_RealCount>).
          super_RealCount.count)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar10 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/FuncInfo.h"
                       ,0x2be,
                       "(!Js::FunctionBody::ShouldShareInlineCaches() || cacheList->Count() <= 1)",
                       "!Js::FunctionBody::ShouldShareInlineCaches() || cacheList->Count() <= 1");
    if (!bVar5) {
LAB_00827f27:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar10 = 0;
  }
  if ((DAT_015d6347 == '\x01') &&
     ((SList<InlineCacheUnit,_Memory::ArenaAllocator,_RealCount> *)
      (pSStack_40->super_SListBase<InlineCacheUnit,_Memory::ArenaAllocator,_RealCount>).
      super_SListNodeBase<Memory::ArenaAllocator>.next != pSStack_40)) {
    pTVar12 = SListBase<InlineCacheUnit,_Memory::ArenaAllocator,_RealCount>::Head
                        (&pSStack_40->
                          super_SListBase<InlineCacheUnit,_Memory::ArenaAllocator,_RealCount>);
    uVar9 = (pTVar12->field_0).field_0.loadCacheId;
    uVar7 = (pTVar12->field_0).field_0.loadMethodCacheId;
    uVar8 = (pTVar12->field_0).field_0.storeCacheId;
    if (isLoadMethod) {
      uVar6 = uVar7;
      if (uVar7 == 0xffffffff) {
        uVar7 = NewInlineCache(this);
        uVar6 = uVar7;
      }
    }
    else if (isStore) {
      uVar6 = uVar8;
      if (uVar8 == 0xffffffff) {
        uVar8 = NewInlineCache(this);
        uVar6 = uVar8;
      }
    }
    else {
      uVar6 = uVar9;
      if (uVar9 == 0xffffffff) {
        uVar9 = NewInlineCache(this);
        uVar6 = uVar9;
      }
    }
    pTVar12 = SListBase<InlineCacheUnit,_Memory::ArenaAllocator,_RealCount>::Head
                        (&pSStack_40->
                          super_SListBase<InlineCacheUnit,_Memory::ArenaAllocator,_RealCount>);
    (pTVar12->field_0).field_0.loadCacheId = uVar9;
    (pTVar12->field_0).field_0.loadMethodCacheId = uVar7;
    (pTVar12->field_0).field_0.storeCacheId = uVar8;
  }
  else {
    uVar6 = NewInlineCache(this);
    pSVar4 = pSStack_40;
    uVar9 = 0xffffffff;
    if (isStore) {
      uVar9 = uVar6;
    }
    if (isLoadMethod) {
      uVar9 = 0xffffffff;
    }
    uVar7 = 0xffffffff;
    if (isLoadMethod) {
      uVar7 = uVar6;
    }
    if (DAT_015d6347 == '\0') {
      uVar9 = 0xffffffff;
    }
    uVar8 = 0xffffffff;
    if (DAT_015d6347 == '\0') {
      uVar7 = 0xffffffff;
      uVar8 = uVar6;
    }
    uVar13 = uVar6;
    if (isStore) {
      uVar13 = uVar8;
    }
    if (isLoadMethod) {
      uVar13 = uVar8;
    }
    pSVar11 = (Type)new<Memory::ArenaAllocator>(0x18,pSStack_40->allocator,0x366bee);
    *(uint *)&pSVar11[1].next = uVar13;
    *(uint *)((long)&pSVar11[1].next + 4) = uVar7;
    *(uint *)&pSVar11[2].next = uVar9;
    pSVar11->next =
         (pSVar4->super_SListBase<InlineCacheUnit,_Memory::ArenaAllocator,_RealCount>).
         super_SListNodeBase<Memory::ArenaAllocator>.next;
    (pSVar4->super_SListBase<InlineCacheUnit,_Memory::ArenaAllocator,_RealCount>).
    super_SListNodeBase<Memory::ArenaAllocator>.next = pSVar11;
    pRVar1 = &(pSVar4->super_SListBase<InlineCacheUnit,_Memory::ArenaAllocator,_RealCount>).
              super_RealCount;
    pRVar1->count = pRVar1->count + 1;
  }
  return uVar6;
}

Assistant:

uint FindOrAddInlineCacheId(Js::RegSlot instanceSlot, Js::PropertyId propertySlot, bool isLoadMethod, bool isStore)
    {
        Assert(instanceSlot != Js::Constants::NoRegister);
        Assert(propertySlot != Js::Constants::NoProperty);
        Assert(!isLoadMethod || !isStore);

        InlineCacheIdMap *properties;
        uint cacheId;

        if (isStore)
        {
            // ... = foo.toString;
            // foo.toString = ...;

            // We need a new cache here to ensure SetProperty() is called, which will set the side-effect bit
            // on the scriptContext.
            switch (propertySlot)
            {
            case Js::PropertyIds::valueOf:
                cacheId = this->NewInlineCache();
                valueOfStoreCacheIds.Prepend(alloc, cacheId);
                return cacheId;

            case Js::PropertyIds::toString:
                cacheId = this->NewInlineCache();
                toStringStoreCacheIds.Prepend(alloc, cacheId);
                return cacheId;
            };
        }

        if (!inlineCacheMap->TryGetValue(instanceSlot, &properties))
        {
            properties = Anew(alloc, InlineCacheIdMap, alloc, 17);
            inlineCacheMap->Add(instanceSlot, properties);
        }

        InlineCacheList* cacheList;
        if (!properties->TryGetValue(propertySlot, &cacheList))
        {
            cacheList = Anew(alloc, InlineCacheList, alloc);
            properties->Add(propertySlot, cacheList);
        }

        // If we share inline caches we should never have more than one entry in the list.
        Assert(!Js::FunctionBody::ShouldShareInlineCaches() || cacheList->Count() <= 1);

        InlineCacheUnit cacheIdUnit;

        if (Js::FunctionBody::ShouldShareInlineCaches() && !cacheList->Empty())
        {
            cacheIdUnit = cacheList->Head();
            if (isLoadMethod)
            {
                if (cacheIdUnit.loadMethodCacheId == (uint)-1)
                {
                    cacheIdUnit.loadMethodCacheId = this->NewInlineCache();
                }
                cacheId = cacheIdUnit.loadMethodCacheId;
            }
            else if (isStore)
            {
                if (cacheIdUnit.storeCacheId == (uint)-1)
                {
                    cacheIdUnit.storeCacheId = this->NewInlineCache();
                }
                cacheId = cacheIdUnit.storeCacheId;
            }
            else
            {
                if (cacheIdUnit.loadCacheId == (uint)-1)
                {
                    cacheIdUnit.loadCacheId = this->NewInlineCache();
                }
                cacheId = cacheIdUnit.loadCacheId;
            }
            cacheList->Head() = cacheIdUnit;
        }
        else
        {
            cacheId = this->NewInlineCache();
            if (Js::FunctionBody::ShouldShareInlineCaches())
            {
                if (isLoadMethod)
                {
                    cacheIdUnit.loadCacheId = (uint)-1;
                    cacheIdUnit.loadMethodCacheId = cacheId;
                    cacheIdUnit.storeCacheId = (uint)-1;
                }
                else if (isStore)
                {
                    cacheIdUnit.loadCacheId = (uint)-1;
                    cacheIdUnit.loadMethodCacheId = (uint)-1;
                    cacheIdUnit.storeCacheId = cacheId;
                }
                else
                {
                    cacheIdUnit.loadCacheId = cacheId;
                    cacheIdUnit.loadMethodCacheId = (uint)-1;
                    cacheIdUnit.storeCacheId = (uint)-1;
                }
            }
            else
            {
                cacheIdUnit.cacheId = cacheId;
            }
            cacheList->Prepend(cacheIdUnit);
        }

        return cacheId;
    }